

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

uint __thiscall cnn::Cluster::sample(Cluster *this,Expression *h,ComputationGraph *cg)

{
  Tensor *pTVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  real rVar5;
  real rVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> dist;
  undefined1 local_58 [40];
  undefined1 local_30 [24];
  uint local_18;
  
  if (this->output_size == 1) {
    uVar3 = 0;
  }
  else if (this->output_size == 2) {
    local_30._16_8_ = h->pg;
    local_18 = (h->i).t;
    predict((Cluster *)local_58,(Expression *)this,(ComputationGraph *)(local_30 + 0x10));
    cnn::expr::logistic((expr *)(local_58 + 0x18),(Expression *)local_58);
    pTVar1 = ComputationGraph::incremental_forward(cg);
    rVar5 = as_scalar(pTVar1);
    rVar6 = rand01();
    uVar3 = (uint)(rVar5 <= rVar6);
  }
  else {
    local_30._0_8_ = h->pg;
    local_30._8_4_ = (h->i).t;
    predict((Cluster *)local_58,(Expression *)this,(ComputationGraph *)local_30);
    cnn::expr::softmax((expr *)(local_58 + 0x18),(Expression *)local_58);
    pTVar1 = ComputationGraph::incremental_forward(cg);
    as_vector((vector<float,_std::allocator<float>_> *)local_58,pTVar1);
    fVar7 = rand01();
    uVar2 = (long)(local_58._8_8_ - local_58._0_8_) >> 2;
    uVar3 = 0;
    while ((uVar4 = (ulong)uVar3, uVar4 < uVar2 &&
           (fVar7 = fVar7 - *(float *)(local_58._0_8_ + uVar4 * 4), 0.0 <= fVar7))) {
      uVar3 = uVar3 + 1;
    }
    uVar3 = uVar3 - (uVar2 == uVar4);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)local_58);
  }
  return uVar3;
}

Assistant:

unsigned Cluster::sample(expr::Expression h, ComputationGraph& cg) const {
  if (output_size == 1) {
    return 0;
  }
  else if (output_size == 2) {
    logistic(predict(h, cg));
    double prob0 = as_scalar(cg.incremental_forward());
    double p = rand01();
    if (p < prob0) {
      return 0;
    }
    else {
      return 1;
    }
  }
  else {
    softmax(predict(h, cg));
    vector<float> dist = as_vector(cg.incremental_forward());
    unsigned c = 0;
    double p = rand01();
    for (; c < dist.size(); ++c) {
      p -= dist[c];
      if (p < 0.0) { break; }
    }
    if (c == dist.size()) {
      --c;
    }
    return c;
  }
}